

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

int32_t uscript_getScriptExtensions_63
                  (UChar32 c,UScriptCode *scripts,int32_t capacity,UErrorCode *pErrorCode)

{
  ushort uVar1;
  UBool UVar2;
  UScriptCode UVar3;
  UScriptCode UVar4;
  ulong uVar5;
  ushort *puStack_38;
  uint16_t sx;
  uint16_t *scx;
  int32_t length;
  uint32_t scriptX;
  UErrorCode *pErrorCode_local;
  int32_t capacity_local;
  UScriptCode *scripts_local;
  UChar32 c_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    scripts_local._4_4_ = 0;
  }
  else if ((capacity < 0) || ((0 < capacity && (scripts == (UScriptCode *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    scripts_local._4_4_ = 0;
  }
  else {
    UVar3 = u_getUnicodeProperties_63(c,0);
    UVar4 = UVar3 & 0xc000ff;
    if ((uint)UVar4 < 0x400000) {
      if (capacity == 0) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        *scripts = UVar4;
      }
      scripts_local._4_4_ = 1;
    }
    else {
      uVar5 = (ulong)(uint)(UVar3 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET));
      if (0xbfffff < (uint)UVar4) {
        uVar5 = (ulong)(int)(uint)scriptExtensions[uVar5 + 1];
      }
      puStack_38 = scriptExtensions + uVar5;
      scx._0_4_ = 0;
      do {
        uVar1 = *puStack_38;
        if ((int)scx < capacity) {
          scripts[(int)scx] = (uint)uVar1 & 0x7fff;
        }
        scx._0_4_ = (int)scx + 1;
        puStack_38 = puStack_38 + 1;
      } while (uVar1 < 0x8000);
      scripts_local._4_4_ = (int)scx;
      if (capacity < (int)scx) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
    }
  }
  return scripts_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uscript_getScriptExtensions(UChar32 c,
                            UScriptCode *scripts, int32_t capacity,
                            UErrorCode *pErrorCode) {
    uint32_t scriptX;
    int32_t length;
    const uint16_t *scx;
    uint16_t sx;
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(capacity<0 || (capacity>0 && scripts==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        if(capacity==0) {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        } else {
            scripts[0]=(UScriptCode)scriptX;
        }
        return 1;
    }

    scx=scriptExtensions+(scriptX&UPROPS_SCRIPT_MASK);
    if(scriptX>=UPROPS_SCRIPT_X_WITH_OTHER) {
        scx=scriptExtensions+scx[1];
    }
    length=0;
    do {
        sx=*scx++;
        if(length<capacity) {
            scripts[length]=(UScriptCode)(sx&0x7fff);
        }
        ++length;
    } while(sx<0x8000);
    if(length>capacity) {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}